

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_meta_dep(CVmImageLoader *this,ulong siz)

{
  ushort uVar1;
  ushort uVar2;
  vm_meta_entry_t *pvVar3;
  ushort uVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t skip_len;
  short sVar6;
  ulong uVar7;
  ushort *buf_00;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ulong siz_local;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  undefined8 local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  char buf [266];
  
  siz_local = siz;
  if ((this->field_0x90 & 1) != 0) {
    err_throw(0x139);
  }
  this->field_0x90 = this->field_0x90 | 1;
  CVmMetaTable::clear(G_meta_table_X);
  read_data(this,buf,2,&siz_local);
  local_170 = (ulong)(ushort)buf._0_2_;
  for (uVar7 = 0; uVar7 != local_170; uVar7 = uVar7 + 1) {
    local_150 = uVar7;
    read_data(this,buf,2,&siz_local);
    local_180 = siz_local;
    local_158 = (ulong)(ushort)buf._0_2_;
    read_data(this,buf,1,&siz_local);
    uVar7 = (ulong)(byte)buf[0];
    read_data(this,buf,uVar7,&siz_local);
    buf_00 = (ushort *)(buf + uVar7 + 1);
    buf[uVar7] = '\0';
    read_data(this,(char *)buf_00,4,&siz_local);
    local_188 = (ulong)*buf_00;
    uVar1 = *(ushort *)(buf + uVar7 + 3);
    iVar5 = (*this->fp_->_vptr_CVmImageFile[8])();
    local_168 = CONCAT44(extraout_var,iVar5);
    local_160 = siz_local;
    local_178 = (ulong)(uVar1 - 2);
    uVar10 = 0;
    uVar8 = 0;
    for (sVar6 = 0; (ushort)local_188 != sVar6; sVar6 = sVar6 + 1) {
      read_data(this,(char *)buf_00,2,&siz_local);
      if (2 < uVar1) {
        skip_data(this,local_178,&siz_local);
      }
      uVar2 = *buf_00;
      uVar4 = uVar2;
      uVar9 = uVar2;
      if (sVar6 != 0) {
        uVar9 = uVar8;
        if (uVar2 < uVar8) {
          uVar9 = uVar2;
        }
        uVar4 = uVar10;
        if (uVar10 < uVar2) {
          uVar4 = uVar2;
        }
      }
      uVar10 = uVar4;
      uVar8 = uVar9;
    }
    local_180 = local_180 + 2;
    CVmMetaTable::add_entry(G_meta_table_X,buf,local_188,uVar8,uVar10);
    uVar7 = local_150;
    pvVar3 = G_meta_table_X->table_;
    (*this->fp_->_vptr_CVmImageFile[7])(this->fp_,local_168);
    siz_local = local_160;
    for (uVar10 = 1; uVar10 <= (ushort)local_188; uVar10 = uVar10 + 1) {
      read_data(this,(char *)buf_00,2,&siz_local);
      if (2 < uVar1) {
        skip_data(this,local_178,&siz_local);
      }
      uVar8 = *buf_00;
      pvVar3[uVar7].prop_xlat_[(ulong)uVar8 - (ulong)pvVar3[uVar7].min_prop_] = uVar10;
      pvVar3[uVar7].func_xlat_[(ulong)uVar10 - 1] = uVar8;
    }
    skip_len = siz_local - (local_180 - local_158);
    if (local_180 - local_158 <= siz_local && skip_len != 0) {
      skip_data(this,skip_len,&siz_local);
    }
  }
  CVmMetaTable::add_entry_if_new(G_meta_table_X,CVmObject::metaclass_reg_->meta_reg_idx_,0,0,0);
  return;
}

Assistant:

void CVmImageLoader::load_meta_dep(VMG_ ulong siz)
{
    char buf[256 + 10];
    uint entry_cnt;
    uint i;

    /* it's an error if we've already seen a dependency block */
    if (loaded_meta_dep_)
        err_throw(VMERR_IMAGE_METADEP_REDEF);

    /* note that we've loaded a dependency block */
    loaded_meta_dep_ = TRUE;

    /* 
     *   reset the global metaclass table, in case there was anything
     *   defined by a previously-loaded image - since a metaclass's index
     *   in the table is implicit in the load order, we need to make sure
     *   we're starting with a completely clean configuration 
     */
    G_meta_table->clear();
    
    /* read the number of entries in the table */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        ushort j;
        uint len;
        uint prop_cnt;
        uint prop_len;
        vm_meta_entry_t *entry;
        char *p;
        ulong done_size;
        long prop_start_ofs;
        ulong prop_start_siz;
        vm_prop_id_t max_prop;
        vm_prop_id_t min_prop;

        /* 
         *   read the record size, and calculate the value of 'siz' that
         *   we expect when we've parsed this entire record - it's the
         *   current size minus the size of the record (note that we have
         *   to add back in the two bytes of the size record itself, since
         *   'siz' will have been moved past the size record once we've
         *   read it) 
         */
        read_data(buf, 2, &siz);
        done_size = (siz + 2) - osrp2(buf);
        
        /* read the length of the entry */
        read_data(buf, 1, &siz);
        len = (uchar)buf[0];

        /* read the name and null-terminate it */
        read_data(buf, len, &siz);
        buf[len] = '\0';
        p = buf + len + 1;

        /* read the property table information */
        read_data(p, 4, &siz);
        prop_cnt = osrp2(p);
        prop_len = osrp2(p + 2);

        /* 
         *   set min and max to 'invalid' to start with, in case there are
         *   no properties at all in the table
         */
        min_prop = max_prop = VM_INVALID_PROP;

        /* 
         *   Read the properties - pass one: find the minimum and maximum
         *   property ID in the table.  Before we begin, remember where
         *   the properties start in the file, so we can go back and read
         *   the table again on the second pass.  
         */
        prop_start_ofs = fp_->get_seek();
        prop_start_siz = siz;
        for (j = 0 ; j < prop_cnt ; ++j)
        {
            vm_prop_id_t cur;
            
            /* read the next entry */
            read_data(p, 2, &siz);

            /* skip any additional data in the record */
            if (prop_len > 2)
                skip_data(prop_len - 2, &siz);

            /* get the property */
            cur = (vm_prop_id_t)osrp2(p);

            /* 
             *   if this is the first property, it's the max and min so
             *   far; otherwise, remember it if it's the highest or lowest
             *   so far 
             */
            if (j == 0)
            {
                /* this is the first one, so note it unconditionally */
                min_prop = max_prop = cur;
            }
            else
            {
                /* if it's below the current minimum, it's the new minimum */
                if (cur < min_prop)
                    min_prop = cur;

                /* if it's above the current maximum, it's the new maximum */
                if (cur > max_prop)
                    max_prop = cur;
            }
        }

        /* 
         *   Now that we know the minimum and maximum properties in the
         *   table, we can create the dependency record. 
         */
        G_meta_table->add_entry(buf, prop_cnt, min_prop, max_prop);

        /* get a pointer to my new entry */
        entry = G_meta_table->get_entry(i);

        /*
         *   Pass two: read the actual properties into the translation
         *   table.  Seek back to the start of the properties in the file,
         *   then read the ID's.
         *   
         *   Note that add_prop_xlat() expects a 1-based function table
         *   index.  We are in fact reading a function table, so run our
         *   function index counter from 1 to the entry count to yield the
         *   proper 1-based index values.  
         */
        fp_->seek(prop_start_ofs);
        siz = prop_start_siz;
        for (j = 1 ; j <= prop_cnt ; ++j)
        {
            /* read the next entry */
            read_data(p, 2, &siz);

            /* skip any additional data in the record */
            if (prop_len > 2)
                skip_data(prop_len - 2, &siz);

            /* add this entry */
            entry->add_prop_xlat((vm_prop_id_t)osrp2(p), j);
        }

        /* skip any remaining data in the record */
        if (siz > done_size)
            skip_data(siz - done_size, &siz);
    }

    /* 
     *   always add the root object metaclass to the table, whether the
     *   image file defines it or not 
     */
    G_meta_table
        ->add_entry_if_new(CVmObject::metaclass_reg_->get_reg_idx(),
                           0, VM_INVALID_PROP, VM_INVALID_PROP);
}